

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

void Abc_CollectTopOr_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  for (; (((ulong)pObj & 1) == 0 && ((*(uint *)&pObj->field_0x14 & 0xf) == 7));
      pObj = (Abc_Obj_t *)
             ((ulong)(*(uint *)&pObj->field_0x14 >> 0xb & 1) ^
             (ulong)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]])) {
    Abc_CollectTopOr_rec
              ((Abc_Obj_t *)
               ((ulong)(*(uint *)&pObj->field_0x14 >> 10 & 1) ^
               (ulong)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]),vSuper);
  }
  uVar1 = vSuper->nCap;
  if (vSuper->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_002a283c;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vSuper->pArray,(ulong)uVar1 << 4);
      }
      vSuper->pArray = ppvVar2;
    }
    vSuper->nCap = iVar3;
  }
LAB_002a283c:
  iVar3 = vSuper->nSize;
  vSuper->nSize = iVar3 + 1;
  vSuper->pArray[iVar3] = pObj;
  return;
}

Assistant:

void Abc_CollectTopOr_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( Abc_ObjIsComplement(pObj) || !Abc_ObjIsNode(pObj) )
    {
        Vec_PtrPush( vSuper, pObj );
        return;
    }
    // go through the branches
    Abc_CollectTopOr_rec( Abc_ObjChild0(pObj), vSuper );
    Abc_CollectTopOr_rec( Abc_ObjChild1(pObj), vSuper );
}